

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgRuleLocalPolynomial.hpp
# Opt level: O3

double TasGrid::RuleLocal::evalPWCubic<(TasGrid::RuleLocal::erule)4>(int point,double x)

{
  double dVar1;
  double dVar2;
  
  if (point == 2) {
    return (x + 1.0) * (1.0 - x);
  }
  if (point != 1) {
    if (point == 0) {
      return 1.0 - x;
    }
    dVar2 = x + 1.0;
    dVar1 = 1.0 - x;
    if ((point & 1U) != 0) {
      x = -x;
    }
    return ((x + 3.0) * dVar1 * dVar2) / 3.0;
  }
  return x + 1.0;
}

Assistant:

double evalPWCubic(int point, double x) {
        if (effective_rule == erule::localp){
            switch(point) {
                case 0: return 1.0;
                case 1: return 1.0 - x;
                case 2: return 1.0 + x;
                case 3:
                case 4: return (1.0 - x) * (1.0 + x);
                default:
                    return (point % 2 == 0) ? (1.0 - x) * (1.0 + x) * (3.0 + x) / 3.0 : (1.0 - x) * (1.0 + x) * (3.0 - x) / 3.0;
            };
        }else if (effective_rule == erule::localp0){
            if (point == 0) return (1.0 - x) * (1.0 + x);
        }else if (effective_rule == erule::localpb){
            switch(point) {
                case 0: return 1.0 - x;
                case 1: return 1.0 + x;
                case 2: return (1.0 - x) * (1.0 + x);
                default:
                    return (point % 2 == 0) ? (1.0 - x) * (1.0 + x) * (3.0 + x) / 3.0 : (1.0 - x) * (1.0 + x) * (3.0 - x) / 3.0;
            };
        }
        return (point % 2 == 0) ? (1.0 - x) * (1.0 + x) * (3.0 + x) / 3.0 : (1.0 - x) * (1.0 + x) * (3.0 - x) / 3.0;
    }